

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O1

void re2c::BitMap::gen(OutputFile *o,uint32_t ind,uint32_t lb,uint32_t ub)

{
  uint *puVar1;
  ulong __n;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint32_t n;
  OutputFile *pOVar7;
  opt_t *poVar8;
  undefined8 *puVar9;
  void *__s;
  uint *puVar10;
  undefined8 *puVar11;
  uint32_t n_00;
  uint *puVar12;
  uint uVar13;
  ulong uVar14;
  
  if ((first == (undefined8 *)0x0) || (bUsedYYBitmap != '\x01')) {
    return;
  }
  pOVar7 = OutputFile::wind(o,ind);
  pOVar7 = OutputFile::ws(pOVar7,"static const unsigned char ");
  poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  pOVar7 = OutputFile::wstring(pOVar7,&poVar8->yybm);
  OutputFile::ws(pOVar7,"[] = {");
  puVar11 = first;
  uVar13 = 0;
  puVar9 = first;
  do {
    puVar9 = (undefined8 *)puVar9[2];
    uVar13 = uVar13 + 1;
  } while (puVar9 != (undefined8 *)0x0);
  uVar5 = ub - lb;
  __n = (ulong)uVar5 * 4;
  __s = operator_new__(__n);
  if (puVar11 != (undefined8 *)0x0) {
    n_00 = 0;
    n = 1;
    do {
      memset(__s,0,__n);
      uVar6 = 0x80;
      do {
        *(uint32_t *)(puVar11 + 3) = n_00;
        *(uint *)((long)puVar11 + 0x1c) = uVar6;
        uVar14 = (ulong)*(uint *)*puVar11;
        if (uVar14 != 0) {
          lVar3 = puVar11[1];
          puVar12 = *(uint **)((uint *)*puVar11 + 2);
          puVar10 = puVar12 + uVar14 * 4;
          uVar14 = 0;
          do {
            if (((*(long *)(puVar12 + 2) == lVar3) && ((uint)uVar14 < 0x100)) &&
               ((uint)uVar14 < *puVar12)) {
              do {
                puVar1 = (uint *)((long)__s + (ulong)((int)uVar14 - lb) * 4);
                *puVar1 = *puVar1 | uVar6;
                if (0xfe < uVar14) break;
                uVar14 = uVar14 + 1;
              } while (uVar14 < *puVar12);
            }
            uVar14 = (ulong)*puVar12;
            puVar12 = puVar12 + 4;
          } while (puVar12 < puVar10);
        }
        puVar11 = (undefined8 *)puVar11[2];
      } while ((puVar11 != (undefined8 *)0x0) && (bVar4 = 1 < uVar6, uVar6 = uVar6 >> 1, bVar4));
      if (8 < uVar13) {
        pOVar7 = OutputFile::ws(o,"\n");
        pOVar7 = OutputFile::wind(pOVar7,ind + 1);
        pOVar7 = OutputFile::ws(pOVar7,"/* table ");
        pOVar7 = OutputFile::wu32(pOVar7,n);
        pOVar7 = OutputFile::ws(pOVar7," .. ");
        uVar2 = n + 7;
        if (uVar13 <= n + 7) {
          uVar2 = uVar13;
        }
        pOVar7 = OutputFile::wu32(pOVar7,uVar2);
        pOVar7 = OutputFile::ws(pOVar7,": ");
        pOVar7 = OutputFile::wu32(pOVar7,n_00);
        OutputFile::ws(pOVar7," */");
      }
      if (ub != lb) {
        uVar14 = 0;
        do {
          if ((uVar14 & 7) == 0) {
            pOVar7 = OutputFile::ws(o,"\n");
            OutputFile::wind(pOVar7,ind + 1);
          }
          poVar8 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          uVar2 = *(uint32_t *)((long)__s + uVar14 * 4);
          if (poVar8->yybmHexTable == true) {
            OutputFile::wu32_hex(o,uVar2);
          }
          else {
            OutputFile::wu32_width(o,uVar2,3);
          }
          OutputFile::ws(o,", ");
          uVar14 = uVar14 + 1;
        } while (uVar5 != uVar14);
      }
      n_00 = n_00 + uVar5;
      n = n + 8;
    } while (puVar11 != (undefined8 *)0x0);
  }
  pOVar7 = OutputFile::ws(o,"\n");
  pOVar7 = OutputFile::wind(pOVar7,ind);
  OutputFile::ws(pOVar7,"};\n");
  operator_delete__(__s);
  return;
}

Assistant:

void BitMap::gen(OutputFile & o, uint32_t ind, uint32_t lb, uint32_t ub)
{
	if (first && bUsedYYBitmap)
	{
		o.wind(ind).ws("static const unsigned char ").wstring(opts->yybm).ws("[] = {");

		uint32_t c = 1, n = ub - lb;
		const BitMap *cb = first;

		while((cb = cb->next) != NULL) {
			++c;
		}
		BitMap *b = first;

		uint32_t *bm = new uint32_t[n];
		
		for (uint32_t i = 0, t = 1; b; i += n, t += 8)
		{
			memset(bm, 0, n * sizeof(uint32_t));

			for (uint32_t m = 0x80; b && m; m >>= 1)
			{
				b->i = i;
				b->m = m;
				doGen(b->go, b->on, bm, lb, m);
				b = const_cast<BitMap*>(b->next);
			}

			if (c > 8)
			{
				o.ws("\n").wind(ind+1).ws("/* table ").wu32(t).ws(" .. ").wu32(std::min(c, t+7)).ws(": ").wu32(i).ws(" */");
			}

			for (uint32_t j = 0; j < n; ++j)
			{
				if (j % 8 == 0)
				{
					o.ws("\n").wind(ind+1);
				}

				if (opts->yybmHexTable)
				{
					o.wu32_hex(bm[j]);
				}
				else
				{
					o.wu32_width(bm[j], 3);
				}
				o.ws(", ");
			}
		}

		o.ws("\n").wind(ind).ws("};\n");
		
		delete[] bm;
	}
}